

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O0

int GetDefaultLocaleMask(TCascStorage *hs,PQUERY_KEY pTagsString)

{
  LPBYTE pBVar1;
  size_t sVar2;
  DWORD DVar3;
  uint local_2c;
  LPBYTE pBStack_28;
  DWORD dwLocaleMask;
  char *szTagPtr;
  char *szTagEnd;
  PQUERY_KEY pTagsString_local;
  TCascStorage *hs_local;
  
  pBVar1 = pTagsString->pbData;
  sVar2 = pTagsString->cbData;
  pBStack_28 = pTagsString->pbData;
  local_2c = 0;
  while (pBStack_28 < pBVar1 + sVar2) {
    if ((pBVar1 + sVar2 < pBStack_28 + 4) || ((pBStack_28[4] != ',' && (pBStack_28[4] != ' ')))) {
      pBStack_28 = pBStack_28 + 1;
    }
    else {
      DVar3 = GetLocaleMask((char *)pBStack_28);
      local_2c = local_2c | DVar3;
      pBStack_28 = pBStack_28 + 4;
    }
  }
  hs->dwDefaultLocale = local_2c;
  return 0;
}

Assistant:

static int GetDefaultLocaleMask(TCascStorage * hs, PQUERY_KEY pTagsString)
{
    char * szTagEnd = (char *)pTagsString->pbData + pTagsString->cbData;
    char * szTagPtr = (char *)pTagsString->pbData;
    DWORD dwLocaleMask = 0;

    while(szTagPtr < szTagEnd)
    {
        // Could this be a locale string?
        if((szTagPtr + 4) <= szTagEnd && (szTagPtr[4] == ',' ||  szTagPtr[4] == ' '))
        {
            // Check whether the current tag is a language identifier
            dwLocaleMask = dwLocaleMask | GetLocaleMask(szTagPtr);
            szTagPtr += 4;
        }
        else
        {
            szTagPtr++;
        }
    }

    hs->dwDefaultLocale = dwLocaleMask;
    return ERROR_SUCCESS;
}